

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.cpp
# Opt level: O3

void special_null_test(void)

{
  rtosc_arg_val_t a;
  rtosc_arg_val_t local_20;
  
  rtosc_arg_val_null(&local_20,'t');
  assert_int_eq(0,local_20.val.i,"(0)\'t\'",0x61);
  rtosc_arg_val_null(&local_20,'s');
  assert_null((void *)CONCAT44(local_20.val.h._4_4_,local_20.val.i),"(0)\'s\'",100);
  rtosc_arg_val_null(&local_20,'r');
  assert_int_eq(0,local_20.val.i,"(0)\'r\'",0x67);
  rtosc_arg_val_null(&local_20,'T');
  assert_int_eq((int)local_20.val.T,0,"(0)\'T\'",0x6a);
  assert_char_eq(local_20.type,'F',"(0)\'T\' (type)",0x6b);
  rtosc_arg_val_null(&local_20,'S');
  assert_null((void *)CONCAT44(local_20.val.h._4_4_,local_20.val.i),"(0)\'S\'",0x6e);
  rtosc_arg_val_null(&local_20,'F');
  assert_int_eq((int)local_20.val.T,0,"(0)\'F\'",0x71);
  assert_char_eq(local_20.type,'F',"(0)\'F\' (type)",0x72);
  return;
}

Assistant:

void special_null_test()
{
    rtosc_arg_val_t a;
    rtosc_arg_val_null(&a, 't');
    assert_int_eq(0, a.val.t, "(0)'t'", __LINE__);

    rtosc_arg_val_null(&a, 's');
    assert_null(a.val.s, "(0)'s'", __LINE__);

    rtosc_arg_val_null(&a, 'r');
    assert_int_eq(0, a.val.i, "(0)'r'", __LINE__);

    rtosc_arg_val_null(&a, 'T');
    assert_int_eq(a.val.T, 0, "(0)'T'", __LINE__);
    assert_char_eq(a.type, 'F', "(0)'T' (type)", __LINE__);

    rtosc_arg_val_null(&a, 'S');
    assert_null(a.val.s, "(0)'S'", __LINE__);

    rtosc_arg_val_null(&a, 'F');
    assert_int_eq(a.val.T, 0, "(0)'F'", __LINE__);
    assert_char_eq(a.type, 'F', "(0)'F' (type)", __LINE__);
}